

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.c
# Opt level: O3

int * get_stem_contributions_d0
                (vrna_fold_compound_t *fc,int j,vrna_callback_hc_evaluate *evaluate,
                default_data *hc_dat_local,sc_wrapper_f5 *sc_wrapper)

{
  vrna_param_t *pvVar1;
  int *piVar2;
  int *piVar3;
  uchar uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int *piVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  code *pcVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  char *local_b0;
  char *local_90;
  code *local_70;
  
  lVar20 = (long)j;
  piVar10 = (int *)vrna_alloc(j * 4);
  pvVar1 = fc->params;
  piVar2 = fc->jindx;
  piVar3 = (fc->matrices->field_2).field_0.c;
  uVar9 = (pvVar1->model_details).min_loop_size;
  iVar8 = piVar2[lVar20];
  uVar19 = ~uVar9;
  uVar16 = uVar19 + j;
  iVar5 = uVar16 + iVar8;
  if (fc->type == VRNA_FC_TYPE_SINGLE) {
    local_b0 = (fc->field_23).field_0.ptype;
    pcVar15 = (code *)sc_wrapper->red_stem;
    if ((int)uVar16 < 2) {
      uVar19 = 1;
      local_90 = (char *)0x0;
      goto LAB_00120625;
    }
    local_70 = (code *)sc_wrapper->decomp_stem;
    iVar8 = ~uVar9 + iVar8;
    iVar14 = -uVar9;
    iVar17 = -2 - uVar9;
    local_90 = (char *)0x0;
    lVar18 = 0;
    do {
      piVar10[(ulong)uVar16 + lVar18] = 10000000;
      if ((piVar3[iVar5 + lVar18] != 10000000) &&
         (uVar4 = (*evaluate)(1,j,j + iVar17,j + uVar19,'\x12',hc_dat_local), uVar4 != '\0')) {
        piVar10[(ulong)uVar16 + lVar18] = piVar3[iVar5 + lVar18];
        uVar6 = vrna_get_ptype(j + iVar8,local_b0);
        iVar7 = 0;
        if (2 < uVar6) {
          iVar7 = pvVar1->TerminalAU;
        }
        piVar10[(ulong)uVar16 + lVar18] = piVar10[(ulong)uVar16 + lVar18] + iVar7;
      }
      lVar18 = lVar18 + -1;
      iVar8 = iVar8 + -1;
      iVar7 = j + iVar14;
      iVar14 = iVar14 + -1;
      iVar17 = iVar17 + -1;
      uVar19 = uVar19 - 1;
    } while (2 < iVar7 + -1);
    uVar19 = 1;
  }
  else {
    uVar19 = (fc->field_23).field_1.n_seq;
    local_90 = (fc->field_23).field_0.ptype_pf_compat;
    pcVar15 = (code *)sc_wrapper->red_stem;
    local_70 = (code *)sc_wrapper->decomp_stem;
    if (fc->type == VRNA_FC_TYPE_COMPARATIVE) {
      if ((int)uVar16 < 2) {
        local_b0 = (char *)0x0;
        goto LAB_00120625;
      }
      uVar11 = (ulong)uVar16;
      lVar18 = (long)iVar5;
      local_b0 = (char *)0x0;
      do {
        piVar10[uVar11] = 10000000;
        iVar8 = (int)uVar11;
        if (((piVar3[lVar18] != 10000000) &&
            (uVar4 = (*evaluate)(1,j,iVar8 + -1,iVar8,'\x12',hc_dat_local), uVar4 != '\0')) &&
           (piVar10[uVar11] = piVar3[lVar18], uVar19 != 0)) {
          uVar12 = 0;
          do {
            uVar6 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_90 + uVar12 * 8) + uVar11 * 2)
                                      ,(int)*(short *)(*(long *)(local_90 + uVar12 * 8) + lVar20 * 2
                                                      ),&pvVar1->model_details);
            iVar5 = 0;
            if (2 < uVar6) {
              iVar5 = pvVar1->TerminalAU;
            }
            piVar10[uVar11] = piVar10[uVar11] + iVar5;
            uVar12 = uVar12 + 1;
          } while (uVar19 != uVar12);
        }
        uVar11 = uVar11 - 1;
        lVar18 = lVar18 + -1;
      } while (2 < iVar8);
    }
    else {
      local_b0 = (char *)0x0;
    }
  }
  if ((local_70 != (code *)0x0) && (1 < (int)uVar16)) {
    piVar13 = piVar10 + uVar16;
    iVar8 = j - uVar9;
    do {
      iVar5 = iVar8 + -1;
      if (*piVar13 != 10000000) {
        iVar8 = (*local_70)(j,iVar8 + -2,iVar5,sc_wrapper);
        *piVar13 = *piVar13 + iVar8;
      }
      piVar13 = piVar13 + -1;
      iVar8 = iVar5;
    } while (2 < iVar5);
  }
LAB_00120625:
  piVar10[1] = 10000000;
  iVar8 = piVar2[lVar20];
  if ((piVar3[(long)iVar8 + 1] != 10000000) &&
     (uVar4 = (*evaluate)(1,j,1,j,'\x0e',hc_dat_local), uVar4 != '\0')) {
    piVar10[1] = piVar3[(long)iVar8 + 1];
    if (fc->type == VRNA_FC_TYPE_SINGLE) {
      uVar9 = vrna_get_ptype(iVar8 + 1,local_b0);
      iVar8 = 0;
      if (2 < uVar9) {
        iVar8 = pvVar1->TerminalAU;
      }
      piVar10[1] = piVar10[1] + iVar8;
    }
    else if ((fc->type == VRNA_FC_TYPE_COMPARATIVE) && (uVar19 != 0)) {
      uVar11 = 0;
      do {
        uVar9 = vrna_get_ptype_md((int)*(short *)(*(long *)(local_90 + uVar11 * 8) + 2),
                                  (int)*(short *)(*(long *)(local_90 + uVar11 * 8) + lVar20 * 2),
                                  &pvVar1->model_details);
        iVar8 = 0;
        if (2 < uVar9) {
          iVar8 = pvVar1->TerminalAU;
        }
        piVar10[1] = piVar10[1] + iVar8;
        uVar11 = uVar11 + 1;
      } while (uVar19 != uVar11);
    }
    if (pcVar15 != (code *)0x0) {
      iVar8 = (*pcVar15)(j,1,j,sc_wrapper);
      piVar10[1] = piVar10[1] + iVar8;
    }
  }
  return piVar10;
}

Assistant:

int *
get_stem_contributions_d0(vrna_fold_compound_t      *fc,
                          int                       j,
                          vrna_callback_hc_evaluate *evaluate,
                          struct default_data       *hc_dat_local,
                          struct sc_wrapper_f5      *sc_wrapper)
{
  char                    *ptype;
  short                   **S;
  unsigned int            s, n_seq, type;
  int                     i, ij, *indx, turn, *c, *stems;
  vrna_param_t            *P;
  vrna_md_t               *md;

  sc_f5_split_in_ext_stem *sc_spl_stem;
  sc_f5_reduce_to_stem    *sc_red_stem;

  stems = (int *)vrna_alloc(sizeof(int) * j);

  P     = fc->params;
  md    = &(P->model_details);
  indx  = fc->jindx;
  c     = fc->matrices->c;
  turn  = md->min_loop_size;
  ij    = indx[j] + j - turn - 1;
  ptype = (fc->type == VRNA_FC_TYPE_SINGLE) ? fc->ptype : NULL;
  n_seq = (fc->type == VRNA_FC_TYPE_SINGLE) ? 1 : fc->n_seq;
  S     = (fc->type == VRNA_FC_TYPE_SINGLE) ? NULL : fc->S;

  sc_spl_stem = sc_wrapper->decomp_stem;
  sc_red_stem = sc_wrapper->red_stem;

  switch (fc->type) {
    case VRNA_FC_TYPE_SINGLE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;

        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i]  = c[ij];
          type      = vrna_get_ptype(ij, ptype);
          stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
        }
      }
      break;

    case VRNA_FC_TYPE_COMPARATIVE:
      for (i = j - turn - 1; i > 1; i--, ij--) {
        stems[i] = INF;
        if ((c[ij] != INF) &&
            (evaluate(1, j, i - 1, i, VRNA_DECOMP_EXT_EXT_STEM, hc_dat_local))) {
          stems[i] = c[ij];

          for (s = 0; s < n_seq; s++) {
            type      = vrna_get_ptype_md(S[s][i], S[s][j], md);
            stems[i]  += vrna_E_ext_stem(type, -1, -1, P);
          }
        }
      }
      break;
  }

  if (sc_spl_stem)
    for (i = j - turn - 1; i > 1; i--)
      if (stems[i] != INF)
        stems[i] += sc_spl_stem(j, i - 1, i, sc_wrapper);

  stems[1]  = INF;
  ij        = indx[j] + 1;

  if ((c[ij] != INF) &&
      (evaluate(1, j, 1, j, VRNA_DECOMP_EXT_STEM, hc_dat_local))) {
    stems[1] = c[ij];

    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        type      = vrna_get_ptype(ij, ptype);
        stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        for (s = 0; s < n_seq; s++) {
          type      = vrna_get_ptype_md(S[s][1], S[s][j], md);
          stems[1]  += vrna_E_ext_stem(type, -1, -1, P);
        }
        break;
    }

    if (sc_red_stem)
      stems[1] += sc_red_stem(j, 1, j, sc_wrapper);
  }

  return stems;
}